

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O3

int __thiscall OpenMD::HBondJumpR::registerHydrogen(HBondJumpR *this,int frame,int hIndex)

{
  pointer pvVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  int *piVar3;
  int iVar4;
  iterator iVar5;
  vector<int,std::allocator<int>> *pvVar6;
  long lVar7;
  int local_34;
  int local_30;
  int local_2c;
  
  lVar7 = *(long *)&(this->super_HBondJump).GIDtoH_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[frame].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data;
  iVar4 = *(int *)(lVar7 + (long)hIndex * 4);
  if (iVar4 != -1) {
    return iVar4;
  }
  pvVar6 = (vector<int,std::allocator<int>> *)
           ((this->super_HBondJump).hydrogen_.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + frame);
  iVar5._M_current = *(int **)(pvVar6 + 8);
  iVar4 = (int)((ulong)((long)iVar5._M_current - *(long *)pvVar6) >> 2);
  *(int *)(lVar7 + (long)hIndex * 4) = iVar4;
  local_30 = hIndex;
  local_2c = frame;
  if (iVar5._M_current == *(int **)(pvVar6 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar6,iVar5,&local_30);
  }
  else {
    *iVar5._M_current = hIndex;
    *(int **)(pvVar6 + 8) = iVar5._M_current + 1;
  }
  pvVar2 = (this->super_HBondJump).acceptor_.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + frame;
  local_34 = -1;
  iVar5._M_current =
       (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar5._M_current ==
      (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,iVar5,&local_34);
  }
  else {
    *iVar5._M_current = -1;
    (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((this->super_HBondJump).selected_.
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame,false);
  pvVar2 = (this->rbin_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + frame;
  local_34 = -1;
  iVar5._M_current =
       (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar5._M_current ==
      (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,iVar5,&local_34);
  }
  else {
    *iVar5._M_current = -1;
    (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar5._M_current + 1;
  }
  if (frame == 0) {
    pvVar2 = (this->super_HBondJump).lastAcceptor_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_34 = -1;
    iVar5._M_current =
         (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar5._M_current ==
        (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,iVar5,&local_34);
    }
    else {
      *iVar5._M_current = -1;
      (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar5._M_current + 1;
    }
    pvVar6 = (vector<int,std::allocator<int>> *)
             ((this->super_HBondJump).acceptorStartFrame_.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + frame);
    iVar5._M_current = *(int **)(pvVar6 + 8);
    if (iVar5._M_current == *(int **)(pvVar6 + 0x10)) {
      piVar3 = &local_2c;
      goto LAB_0013a527;
    }
    *iVar5._M_current = 0;
  }
  else {
    pvVar1 = (this->super_HBondJump).lastAcceptor_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (vector<int,std::allocator<int>> *)(pvVar1 + frame);
    lVar7 = (long)*(int *)(*(long *)&(this->super_HBondJump).GIDtoH_.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(long)frame + -1].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl +
                          (long)local_30 * 4) * 4;
    piVar3 = (int *)(*(long *)&pvVar1[(long)frame + -1].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar7);
    iVar5._M_current = *(int **)(pvVar6 + 8);
    if (iVar5._M_current == *(int **)(pvVar6 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar6,iVar5,piVar3);
    }
    else {
      *iVar5._M_current = *piVar3;
      *(int **)(pvVar6 + 8) = iVar5._M_current + 1;
    }
    pvVar6 = (vector<int,std::allocator<int>> *)
             ((this->super_HBondJump).acceptorStartFrame_.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + frame);
    piVar3 = (int *)(lVar7 + *(long *)(pvVar6 + -0x18));
    iVar5._M_current = *(int **)(pvVar6 + 8);
    if (iVar5._M_current == *(int **)(pvVar6 + 0x10)) {
LAB_0013a527:
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar6,iVar5,piVar3);
      return iVar4;
    }
    *iVar5._M_current = *piVar3;
  }
  *(int **)(pvVar6 + 8) = iVar5._M_current + 1;
  return iVar4;
}

Assistant:

int HBondJumpR::registerHydrogen(int frame, int hIndex) {
    int index;

    // If this hydrogen wasn't already registered, register it:
    if (GIDtoH_[frame][hIndex] == -1) {
      index = hydrogen_[frame].size();

      GIDtoH_[frame][hIndex] = index;
      hydrogen_[frame].push_back(hIndex);
      acceptor_[frame].push_back(-1);
      selected_[frame].push_back(false);
      rbin_[frame].push_back(-1);

      if (frame == 0) {
        lastAcceptor_[frame].push_back(-1);
        acceptorStartFrame_[frame].push_back(frame);
      } else {
        // Copy the last acceptor.
        int prevIndex = GIDtoH_[frame - 1][hIndex];
        lastAcceptor_[frame].push_back(lastAcceptor_[frame - 1][prevIndex]);
        acceptorStartFrame_[frame].push_back(
            acceptorStartFrame_[frame - 1][prevIndex]);
      }
    } else {
      // This hydrogen was already registered.  Just return the index:
      index = GIDtoH_[frame][hIndex];
    }
    return index;
  }